

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O0

void __thiscall calculator::Token::Token(Token *this,char c)

{
  initializer_list<std::pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_350;
  allocator<std::pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_32f;
  key_equal local_32e;
  hasher local_32d;
  Tag local_32c [20];
  Tag local_2dc;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2d8;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d0;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a8;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_280;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  iterator local_28;
  size_type local_20;
  char local_11;
  undefined1 auStack_10 [7];
  char c_local;
  Token *this_local;
  
  this->_vptr_Token = (_func_int **)&PTR__Token_00136508;
  local_2d8 = &local_2d0;
  local_2dc = And;
  local_11 = c;
  _auStack_10 = this;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>(local_2d8,&local_2dc,(char (*) [2])"&");
  local_2d8 = &local_2a8;
  local_32c[0xf] = 4;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>(local_2d8,local_32c + 0xf,(char (*) [2])"|");
  local_2d8 = &local_280;
  local_32c[0xe] = 5;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>(local_2d8,local_32c + 0xe,(char (*) [2])0x1250fd)
  ;
  local_2d8 = &local_258;
  local_32c[0xd] = 6;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>(local_2d8,local_32c + 0xd,(char (*) [2])"^");
  local_2d8 = &local_230;
  local_32c[0xc] = 7;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>(local_2d8,local_32c + 0xc,(char (*) [2])"~");
  local_2d8 = &local_208;
  local_32c[0xb] = 9;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>(local_2d8,local_32c + 0xb,(char (*) [2])"+");
  local_2d8 = &local_1e0;
  local_32c[10] = 10;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>(local_2d8,local_32c + 10,(char (*) [2])0x12509a);
  local_2d8 = &local_1b8;
  local_32c[9] = 0xb;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>(local_2d8,local_32c + 9,(char (*) [2])0x1246f0);
  local_2d8 = &local_190;
  local_32c[8] = 0xc;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>(local_2d8,local_32c + 8,(char (*) [2])"/");
  local_2d8 = &local_168;
  local_32c[7] = 8;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>(local_2d8,local_32c + 7,(char (*) [2])"=");
  local_2d8 = &local_140;
  local_32c[6] = 0xd;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>(local_2d8,local_32c + 6,(char (*) [2])"%");
  local_2d8 = &local_118;
  local_32c[5] = 0xe;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[3],_true>(local_2d8,local_32c + 5,(char (*) [3])"<<");
  local_2d8 = &local_f0;
  local_32c[4] = 0xf;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[3],_true>(local_2d8,local_32c + 4,(char (*) [3])">>");
  local_2d8 = &local_c8;
  local_32c[3] = 0x10;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[3],_true>(local_2d8,local_32c + 3,(char (*) [3])"**");
  local_2d8 = &local_a0;
  local_32c[2] = 0x13;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>(local_2d8,local_32c + 2,(char (*) [2])0x124a50);
  local_2d8 = &local_78;
  local_32c[1] = 0x16;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>(local_2d8,local_32c + 1,(char (*) [2])"(");
  local_2d8 = &local_50;
  local_32c[0] = END_BRACKET;
  std::
  pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<calculator::Tag,_const_char_(&)[2],_true>(local_2d8,local_32c,(char (*) [2])0x124bc8);
  local_28 = &local_2d0;
  local_20 = 0x11;
  std::
  allocator<std::pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator(&local_32f);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::
  unordered_map<calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<calculator::Tag>,_std::equal_to<calculator::Tag>,_std::allocator<std::pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&this->tagTable,__l,0,&local_32d,&local_32e,&local_32f);
  std::
  allocator<std::pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator(&local_32f);
  local_350 = (pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_28;
  do {
    local_350 = local_350 + -1;
    std::
    pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_350);
  } while (local_350 != &local_2d0);
  this->__tag = Other;
  this->__c = local_11;
  return;
}

Assistant:

Token(char c) : __tag(Tag::Other), __c(c) {}